

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setFont(QWidget *this,QFont *font)

{
  bool bVar1;
  QStyleSheetStyle *this_00;
  QFont *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  undefined1 unaff_retaddr;
  WidgetAttribute unaff_retaddr_00;
  QWidget *in_stack_00000008;
  QStyleSheetStyle *style;
  QWidgetPrivate *d;
  QFont resolvedFont;
  QFont naturalFont;
  QFont *in_stack_ffffffffffffffa8;
  QFont *font_00;
  uint inheritedMask;
  QWidgetPrivate *this_01;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  d_func((QWidget *)0x36cd4f);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36cd71);
  if (bVar1) {
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36cd85);
    ::QPointer::operator_cast_to_QStyle_((QPointer<QStyle> *)0x36cd91);
    this_00 = qt_styleSheet((QStyle *)0x36cd99);
    if (this_00 != (QStyleSheetStyle *)0x0) {
      QStyleSheetStyle::saveWidgetFont(this_00,(QWidget *)in_RDI,in_stack_ffffffffffffffa8);
    }
  }
  QFont::resolveMask(in_RSI);
  inheritedMask = (uint)((ulong)in_RSI >> 0x20);
  setAttribute(in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  font_00 = (QFont *)&local_18;
  QWidgetPrivate::naturalWidgetFont(this_01,inheritedMask);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::resolve((QFont *)&local_28);
  QWidgetPrivate::setFont_helper(in_RDI,font_00);
  QFont::~QFont((QFont *)&local_28);
  QFont::~QFont(font_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setFont(const QFont &font)
{
    Q_D(QWidget);

#ifndef QT_NO_STYLE_STYLESHEET
    const QStyleSheetStyle* style;
    if (d->extra && (style = qt_styleSheet(d->extra->style)))
        style->saveWidgetFont(this, font);
#endif

    setAttribute(Qt::WA_SetFont, font.resolveMask() != 0);

    // Determine which font is inherited from this widget's ancestors and
    // QApplication::font, resolve this against \a font (attributes from the
    // inherited font are copied over). Then propagate this font to this
    // widget's children.
    QFont naturalFont = d->naturalWidgetFont(d->inheritedFontResolveMask);
    QFont resolvedFont = font.resolve(naturalFont);
    d->setFont_helper(resolvedFont);
}